

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrLSR0x5e(CPU *this)

{
  Memory *this_00;
  byte bVar1;
  uint16_t uVar2;
  
  uVar2 = Memory::Read16(this->m,this->PC);
  this->PC = this->PC + 2;
  uVar2 = this->X + uVar2;
  this_00 = this->m;
  bVar1 = Memory::Read8(this_00,uVar2);
  this->field_0x2e = bVar1 << 7 | (bVar1 < 2) << 6 | this->field_0x2e & 0x3e;
  Memory::Write8(this_00,uVar2,bVar1 >> 1);
  return 7;
}

Assistant:

int CPU::instrLSR0x5e() {
	uint16_t address = absolute_x_addr_j();
	m->Write8(address, LSR(m->Read8(address)));
	return 7;
}